

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O1

void __thiscall
spv::Builder::setupFunctionDebugInfo
          (Builder *this,Function *function,char *name,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *paramTypes,
          vector<const_char_*,_std::allocator<const_char_*>_> *paramNames)

{
  ulong argNumber;
  map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
  *this_00;
  Op OVar1;
  Id *pIVar2;
  pointer ppcVar3;
  bool bVar4;
  Id IVar5;
  mapped_type_conflict *pmVar6;
  long lVar7;
  pointer puVar8;
  ulong uVar9;
  Id debugFuncId;
  Id paramId;
  Id paramTypeId;
  Id funcId;
  Id funcTypeId;
  Id local_9c;
  Id local_98;
  uint local_94;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_90;
  stack<unsigned_int,_std::deque<unsigned_int,_std::allocator<unsigned_int>_>_> *local_88;
  vector<const_char_*,_std::allocator<const_char_*>_> *local_80;
  ulong local_78;
  string local_70;
  string local_50;
  
  if (this->emitNonSemanticShaderDebugInfo == true) {
    local_90 = paramTypes;
    local_80 = paramNames;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,name,(allocator<char> *)&local_9c);
    unmangleFunctionName(&local_50,(Builder *)name,&local_70);
    IVar5 = getStringId(this,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p) !=
        &local_50.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_50._M_dataplus._M_p._4_4_,(Id)local_50._M_dataplus._M_p),
                      local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_70._M_dataplus._M_p._4_4_,(Id)local_70._M_dataplus._M_p) !=
        &local_70.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_70._M_dataplus._M_p._4_4_,(Id)local_70._M_dataplus._M_p),
                      local_70.field_2._M_allocated_capacity + 1);
    }
    local_50._M_dataplus._M_p._0_4_ = spv::Function::getFuncTypeId(function);
    this_00 = &this->debugId;
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,(key_type *)&local_50);
    if (*pmVar6 == 0) {
      __assert_fail("debugId[funcTypeId] != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x918,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    local_70._M_dataplus._M_p._0_4_ = (function->functionInstruction).resultId;
    if ((Id)local_70._M_dataplus._M_p == 0) {
      __assert_fail("funcId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x91b,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    IVar5 = makeDebugFunction(this,function,IVar5,(Id)local_50._M_dataplus._M_p);
    local_9c = IVar5;
    pmVar6 = std::
             map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
             ::operator[](this_00,(key_type *)&local_70);
    *pmVar6 = IVar5;
    local_88 = &this->currentDebugScopeId;
    pIVar2 = (this->currentDebugScopeId).c.
             super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
    if (pIVar2 == (this->currentDebugScopeId).c.
                  super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_last + -1) {
      std::deque<unsigned_int,std::allocator<unsigned_int>>::_M_push_back_aux<unsigned_int_const&>
                ((deque<unsigned_int,std::allocator<unsigned_int>> *)local_88,&local_9c);
    }
    else {
      *pIVar2 = local_9c;
      (this->currentDebugScopeId).c.super__Deque_base<unsigned_int,_std::allocator<unsigned_int>_>.
      _M_impl.super__Deque_impl_data._M_finish._M_cur = pIVar2 + 1;
    }
    lVar7 = (long)(local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)(local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                  _M_impl.super__Vector_impl_data._M_start >> 2;
    if (lVar7 != (long)(local_80->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                 (long)(local_80->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                       _M_impl.super__Vector_impl_data._M_start >> 3) {
      __assert_fail("paramTypes.size() == paramNames.size()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                    ,0x923,
                    "void spv::Builder::setupFunctionDebugInfo(Function *, const char *, const std::vector<Id> &, const std::vector<const char *> &)"
                   );
    }
    if ((0 < (int)lVar7) &&
       (puVar8 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start,
       (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
       super__Vector_impl_data._M_finish != puVar8)) {
      local_78 = (ulong)(*(function->parameterInstructions).
                          super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>
                          ._M_impl.super__Vector_impl_data._M_start)->resultId;
      uVar9 = 0;
      do {
        local_94 = puVar8[uVar9];
        OVar1 = (this->module).idToInstruction.
                super__Vector_base<spv::Instruction_*,_std::allocator<spv::Instruction_*>_>._M_impl.
                super__Vector_impl_data._M_start[local_94]->opCode;
        if ((OVar1 == OpTypePointer) || (OVar1 == OpTypeArray)) {
          local_94 = getContainedTypeId(this,local_94,0);
          bVar4 = true;
        }
        else {
          bVar4 = false;
        }
        ppcVar3 = (local_80->super__Vector_base<const_char_*,_std::allocator<const_char_*>_>).
                  _M_impl.super__Vector_impl_data._M_start;
        pmVar6 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&local_94);
        argNumber = uVar9 + 1;
        IVar5 = createDebugLocalVariable(this,*pmVar6,ppcVar3[uVar9],argNumber);
        local_98 = (int)uVar9 + (int)local_78;
        pmVar6 = std::
                 map<unsigned_int,_unsigned_int,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
                 ::operator[](this_00,&local_98);
        *pmVar6 = IVar5;
        if (bVar4) {
          makeDebugDeclare(this,IVar5,local_98);
        }
        else {
          makeDebugValue(this,IVar5,local_98);
        }
        puVar8 = (local_90->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        uVar9 = argNumber;
      } while (argNumber <
               (ulong)((long)(local_90->
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish - (long)puVar8 >> 2));
    }
    if (this->emitNonSemanticShaderDebugInfo == true) {
      std::deque<unsigned_int,_std::allocator<unsigned_int>_>::pop_back(&local_88->c);
    }
  }
  return;
}

Assistant:

void Builder::setupFunctionDebugInfo(Function* function, const char* name, const std::vector<Id>& paramTypes,
                                     const std::vector<char const*>& paramNames)
{

    if (!emitNonSemanticShaderDebugInfo)
        return;

    Id nameId = getStringId(unmangleFunctionName(name));
    Id funcTypeId = function->getFuncTypeId();
    assert(debugId[funcTypeId] != 0);
    Id funcId = function->getId();

    assert(funcId != 0);

    // Make the debug function instruction
    Id debugFuncId = makeDebugFunction(function, nameId, funcTypeId);
    debugId[funcId] = debugFuncId;
    currentDebugScopeId.push(debugFuncId);

    // DebugScope and DebugLine for parameter DebugDeclares
    assert(paramTypes.size() == paramNames.size());
    if ((int)paramTypes.size() > 0) {
        Id firstParamId = function->getParamId(0);

        for (size_t p = 0; p < paramTypes.size(); ++p) {
            bool passByRef = false;
            Id paramTypeId = paramTypes[p];

            // For pointer-typed parameters, they are actually passed by reference and we need unwrap the pointer to get the actual parameter type.
            if (isPointerType(paramTypeId) || isArrayType(paramTypeId)) {
                passByRef = true;
                paramTypeId = getContainedTypeId(paramTypeId);
            }

            auto const& paramName = paramNames[p];
            auto const debugLocalVariableId = createDebugLocalVariable(debugId[paramTypeId], paramName, p + 1);
            auto const paramId = static_cast<Id>(firstParamId + p);
            debugId[paramId] = debugLocalVariableId;

            if (passByRef) {
                makeDebugDeclare(debugLocalVariableId, paramId);
            } else {
                makeDebugValue(debugLocalVariableId, paramId);
            }
        }
    }

    // Clear debug scope stack
    if (emitNonSemanticShaderDebugInfo)
        currentDebugScopeId.pop();
}